

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Enterprise.cpp
# Opt level: O1

void __thiscall
Enterprise::ConcreteMachine<false,_false>::ConcreteMachine
          (ConcreteMachine<false,_false> *this,Target *target,ROMFetcher *rom_fetcher)

{
  AsyncTaskQueue<false,_true,_void> *this_00;
  array<unsigned_char,_65536UL> *__s;
  array<unsigned_char,_16384UL> *__s_00;
  int iVar1;
  int iVar2;
  pointer psVar3;
  pointer psVar4;
  Target *pTVar5;
  bool bVar6;
  pointer pNVar7;
  pointer pNVar8;
  undefined4 *puVar9;
  byte bVar10;
  long lVar11;
  pointer pNVar12;
  size_t sVar13;
  pointer pNVar14;
  ConcreteMachine<false,_false> *this_01;
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *pvVar15;
  Request request;
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  undefined1 local_250 [8];
  bool local_248;
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> local_240;
  Node local_228;
  ConcreteMachine<false,_false> *local_200;
  undefined1 local_1f8 [8];
  undefined1 auStack_1f0 [8];
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> local_1e8;
  pointer pNStack_1d0;
  Target *local_1c0;
  undefined1 local_1b8 [16];
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> local_1a8;
  Request local_188;
  LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true> *local_160;
  undefined1 local_158 [16];
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> local_148;
  Request local_130;
  EXDos *local_108;
  AsyncTaskQueue<false,_true,_void> *local_100;
  Processor<Enterprise::ConcreteMachine<false,_false>,_false,_false> *local_f8;
  array<unsigned_char,_65536UL> *local_f0;
  undefined1 local_e8 [16];
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> local_d8;
  Request local_c0;
  undefined1 local_98 [16];
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> local_88;
  Request local_70;
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> local_48;
  
  (this->super_Source)._vptr_Source = (_func_int **)&PTR___cxa_pure_virtual_005983c8;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR___cxa_pure_virtual_00598da0;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__Machine_005a0998;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&PTR___cxa_pure_virtual_005983e0;
  local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8 = (undefined1  [8])0x0;
  auStack_1f0._0_4_ = Any;
  auStack_1f0._4_4_ = None;
  pNStack_1d0 = (pointer)0x0;
  local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auStack_1f0;
  local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)auStack_1f0;
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (&this->super_MappedKeyboardMachine,
             (set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
              *)local_1f8);
  std::
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~_Rb_tree((_Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
               *)local_1f8);
  (this->super_TimedMachine).clock_rate_ = 1.0;
  (this->super_TimedMachine).clock_conversion_error_ = 0.0;
  (this->super_TimedMachine).speed_multiplier_ = 1.0;
  (this->super_TypeRecipient<Enterprise::CharacterMapper>).typer_._M_t.
  super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>._M_t.
  super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
  super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl = (Typer *)0x0;
  (this->super_TypeRecipient<Enterprise::CharacterMapper>).previous_typer_._M_t.
  super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>._M_t.
  super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
  super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl = (Typer *)0x0;
  (this->super_TypeRecipient<Enterprise::CharacterMapper>).character_mapper.super_CharacterMapper.
  _vptr_CharacterMapper = (_func_int **)&PTR__CharacterMapper_005a1670;
  (this->super_Source)._vptr_Source = (_func_int **)&PTR_set_activity_observer_005a0678;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_005a0718;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_005a0738;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_005a0758;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_005a0770;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_005a07a0;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_005a07e0;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_005a07f8;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_005a0830;
  (this->super_TypeRecipient<Enterprise::CharacterMapper>).super_Delegate.super_KeyActions.
  _vptr_KeyActions = (_func_int **)&PTR_set_key_state_005a0878;
  memset(&this->ram_,0,0x40000);
  bVar10 = 0xfc;
  if (target->model != Enterprise64) {
    bVar10 = (target->model != Enterprise256) << 3 | 0xf0;
  }
  this->min_ram_slot_ = bVar10;
  this->write_pointers_[2] = (uint8_t *)0x0;
  this->write_pointers_[3] = (uint8_t *)0x0;
  this->write_pointers_[0] = (uint8_t *)0x0;
  this->write_pointers_[1] = (uint8_t *)0x0;
  this->read_pointers_[2] = (uint8_t *)0x0;
  this->read_pointers_[3] = (uint8_t *)0x0;
  this->read_pointers_[0] = (uint8_t *)0x0;
  this->read_pointers_[1] = (uint8_t *)0x0;
  this->pages_[0] = 0x80;
  this->pages_[1] = 0x80;
  this->pages_[2] = 0x80;
  this->pages_[3] = 0x80;
  this->wait_mode_ = OnAllAccesses;
  this->is_video_[0] = false;
  this->is_video_[1] = false;
  this->is_video_[2] = false;
  this->is_video_[3] = false;
  (this->keyboard_mapper_).super_KeyboardMapper._vptr_KeyboardMapper =
       (_func_int **)&PTR_mapped_key_for_key_005a1640;
  this->active_key_line_ = '\0';
  this->should_skip_splash_screen_ = false;
  this->typer_delay_ = 0x1e;
  this->interrupt_mask_ = '\0';
  this->interrupt_state_ = '\0';
  local_200 = this;
  CPU::Z80::Processor<Enterprise::ConcreteMachine<false,_false>,_false,_false>::Processor
            (&this->z80_,this);
  (this->nick_).super_Observer._vptr_Observer =
       (_func_int **)&PTR_set_component_prefers_clocking_005a0a30;
  local_1c0 = target;
  local_f8 = &this->z80_;
  Nick::Nick(&(this->nick_).object_,(this->ram_)._M_elems + 0x30000);
  (this->nick_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
  (this->nick_).time_until_event_.super_WrappedInt<HalfCycles>.length_ = 0;
  (this->nick_).time_overrun_.super_WrappedInt<HalfCycles>.length_ = 0;
  (this->nick_).is_flushed_ = true;
  (this->nick_).did_flush_ = false;
  (this->nick_).clocking_preference_ = JustInTime;
  (this->nick_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
  this->previous_nick_interrupt_line_ = false;
  this_00 = &this->audio_queue_;
  Concurrency::AsyncTaskQueue<false,_true,_void>::AsyncTaskQueue<>(this_00);
  local_100 = this_00;
  Dave::Audio::Audio(&this->dave_audio_,this_00);
  local_160 = &(this->speaker_).
               super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>;
  Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>::PullLowpass
            ((PullLowpass<Enterprise::Dave::Audio> *)local_160,&this->dave_audio_);
  (this->time_since_audio_update_).super_WrappedInt<HalfCycles>.length_ = 0;
  (this->dave_delay_).super_WrappedInt<HalfCycles>.length_ = 2;
  JustInTimeActor<Enterprise::Dave::TimedInterruptSource,_HalfCycles,_1,_8>::JustInTimeActor<>
            (&this->dave_timer_);
  local_108 = &this->exdos_;
  EXDos::EXDos(local_108);
  (this->super_TimedMachine).clock_rate_ = 4000000.0;
  Outputs::Speaker::LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>::
  set_input_rate(local_160,500000.0);
  local_250 = (undefined1  [8])0x2;
  local_248 = false;
  local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  switch(local_1c0->exos_version) {
  case v10:
    ROM::Request::Request((Request *)&local_228,EnterpriseEXOS10,false);
    ROM::Request::operator&&((Request *)local_1f8,(Request *)local_250,(Request *)&local_228);
    break;
  case v20:
    ROM::Request::Request((Request *)&local_228,EnterpriseEXOS20,false);
    ROM::Request::operator&&((Request *)local_1f8,(Request *)local_250,(Request *)&local_228);
    break;
  case v21:
    ROM::Request::Request((Request *)&local_228,EnterpriseEXOS21,false);
    ROM::Request::operator&&((Request *)local_1f8,(Request *)local_250,(Request *)&local_228);
    break;
  case v23:
    ROM::Request::Request((Request *)&local_228,EnterpriseEXOS23,false);
    ROM::Request::operator&&((Request *)local_1f8,(Request *)local_250,(Request *)&local_228);
    break;
  case Any:
    ROM::Request::Request((Request *)local_158,EnterpriseEXOS10,false);
    ROM::Request::Request(&local_130,EnterpriseEXOS20,false);
    ROM::Request::operator||(&local_188,(Request *)local_158,&local_130);
    ROM::Request::Request((Request *)local_e8,EnterpriseEXOS21,false);
    ROM::Request::operator||((Request *)local_1b8,&local_188,(Request *)local_e8);
    ROM::Request::Request(&local_c0,EnterpriseEXOS23,false);
    ROM::Request::operator||((Request *)&local_228,(Request *)local_1b8,&local_c0);
    ROM::Request::operator&&((Request *)local_1f8,(Request *)local_250,(Request *)&local_228);
    local_88.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_98._8_8_ =
         local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_98._0_8_ =
         local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_248 = auStack_1f0[0];
    local_250 = local_1f8;
    local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)local_98);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_1e8);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_228.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_c0.node.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_1a8);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_d8);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_188.node.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_130.node.children);
    pvVar15 = &local_148;
    goto LAB_00332f84;
  default:
    goto switchD_00332d0a_default;
  }
  local_1a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  local_1b8._8_8_ =
       local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_1b8._0_8_ =
       local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_248 = auStack_1f0[0];
  local_250 = local_1f8;
  local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)local_1b8);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_1e8);
  pvVar15 = &local_228.children;
LAB_00332f84:
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(pvVar15);
switchD_00332d0a_default:
  switch(local_1c0->basic_version) {
  case v10:
    ROM::Request::Request((Request *)local_1b8,EnterpriseBASIC10,false);
    ROM::Request::Request((Request *)local_158,EnterpriseBASIC10Part1,false);
    ROM::Request::Request(&local_130,EnterpriseBASIC10Part2,false);
    ROM::Request::operator&&(&local_188,(Request *)local_158,&local_130);
    ROM::Request::operator||((Request *)&local_228,(Request *)local_1b8,&local_188);
    ROM::Request::operator&&((Request *)local_1f8,(Request *)local_250,(Request *)&local_228);
    local_d8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_e8._8_8_ =
         local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_e8._0_8_ =
         local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_248 = auStack_1f0[0];
    local_250 = local_1f8;
    local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)local_e8);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_1e8);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_228.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_188.node.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_130.node.children);
    pvVar15 = &local_148;
    goto LAB_003333e7;
  case v11:
    ROM::Request::Request((Request *)local_1b8,EnterpriseBASIC11,false);
    ROM::Request::Request(&local_188,EnterpriseBASIC11Suffixed,false);
    ROM::Request::operator||((Request *)&local_228,(Request *)local_1b8,&local_188);
    ROM::Request::operator&&((Request *)local_1f8,(Request *)local_250,(Request *)&local_228);
    local_148.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_158._8_8_ =
         local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_158._0_8_ =
         local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_248 = auStack_1f0[0];
    local_250 = local_1f8;
    local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)local_158);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_1e8);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_228.children);
    pvVar15 = &local_188.node.children;
LAB_003333e7:
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(pvVar15);
    pvVar15 = &local_1a8;
    break;
  case v21:
    ROM::Request::Request((Request *)&local_228,EnterpriseBASIC21,false);
    ROM::Request::operator&&((Request *)local_1f8,(Request *)local_250,(Request *)&local_228);
    local_1a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1b8._8_8_ =
         local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_1b8._0_8_ =
         local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_248 = auStack_1f0[0];
    local_250 = local_1f8;
    local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)local_1b8);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_1e8);
    pvVar15 = &local_228.children;
    break;
  case Any:
    ROM::Request::Request((Request *)local_158,EnterpriseBASIC10,false);
    ROM::Request::Request((Request *)local_e8,EnterpriseBASIC10Part1,false);
    ROM::Request::Request(&local_c0,EnterpriseBASIC10Part2,false);
    ROM::Request::operator&&(&local_130,(Request *)local_e8,&local_c0);
    ROM::Request::operator||(&local_188,(Request *)local_158,&local_130);
    ROM::Request::Request((Request *)local_98,EnterpriseBASIC11,false);
    ROM::Request::operator||((Request *)local_1b8,&local_188,(Request *)local_98);
    ROM::Request::Request(&local_70,EnterpriseBASIC21,false);
    ROM::Request::operator||((Request *)&local_228,(Request *)local_1b8,&local_70);
    ROM::Request::operator&&((Request *)local_1f8,(Request *)local_250,(Request *)&local_228);
    local_48.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_248 = auStack_1f0[0];
    local_250 = local_1f8;
    local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_48);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_1e8);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_228.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_70.node.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_1a8);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_88);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_188.node.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_130.node.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_c0.node.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_d8);
    pvVar15 = &local_148;
    break;
  default:
    goto switchD_00332faf_default;
  }
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(pvVar15);
switchD_00332faf_default:
  if (local_1c0->dos == EXDOS) {
    ROM::Request::Request((Request *)&local_228,EnterpriseEXDOS,false);
    ROM::Request::operator&&((Request *)local_1f8,(Request *)local_250,(Request *)&local_228);
    local_1a8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1b8._8_8_ =
         local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_1b8._0_8_ =
         local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_248 = auStack_1f0[0];
    local_250 = local_1f8;
    local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_240.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)local_1b8);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_1e8);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&local_228.children);
  }
  if ((rom_fetcher->super__Function_base)._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  (*rom_fetcher->_M_invoker)
            ((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)local_1f8,(_Any_data *)rom_fetcher,(Request *)local_250);
  bVar6 = ROM::Request::validate((Request *)local_250,(Map *)local_1f8);
  if (!bVar6) {
    puVar9 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar9 = 0;
    __cxa_throw(puVar9,&ROMMachine::Error::typeinfo,0);
  }
  __s = &this->exos_;
  memset(__s,0xff,0x10000);
  local_228.type = 0x2f;
  local_228.name = EnterpriseEXOS20;
  local_228.is_optional = true;
  local_228._9_7_ = 0x32000000;
  lVar11 = 0;
  do {
    iVar1 = *(int *)((long)&local_228.type + lVar11);
    pNVar12 = (pointer)auStack_1f0;
    for (pNVar8 = local_1e8.
                  super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                  _M_impl.super__Vector_impl_data._M_start; pNVar8 != (pointer)0x0;
        pNVar8 = (&(pNVar8->children).
                   super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                   _M_impl.super__Vector_impl_data._M_start)[iVar2 < iVar1]) {
      iVar2 = *(int *)&(pNVar8->children).
                       super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
      if (iVar1 <= iVar2) {
        pNVar12 = pNVar8;
      }
    }
    pNVar8 = (pointer)auStack_1f0;
    if ((pNVar12 != (pointer)auStack_1f0) &&
       (pNVar8 = pNVar12,
       iVar1 < *(int *)&(pNVar12->children).
                        super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage)) {
      pNVar8 = (pointer)auStack_1f0;
    }
    if (pNVar8 != (pointer)auStack_1f0) {
      sVar13 = (long)*(_Base_ptr *)&pNVar8[1].is_optional - (long)*(_Base_ptr *)(pNVar8 + 1);
      if (0xffff < sVar13) {
        sVar13 = 0x10000;
      }
      memcpy(__s,*(_Base_ptr *)(pNVar8 + 1),sVar13);
      break;
    }
    lVar11 = lVar11 + 4;
  } while (lVar11 != 0x10);
  __s_00 = &this->basic_;
  local_f0 = __s;
  memset(__s_00,0xff,0x4000);
  pNVar8 = local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_228.type = 0x33;
  local_228.name = EnterpriseBASIC11;
  local_228.is_optional = true;
  local_228._9_7_ = 0x38000000;
  lVar11 = 0;
  bVar6 = false;
  do {
    iVar1 = *(int *)((long)&local_228.type + lVar11);
    pNVar7 = (pointer)auStack_1f0;
    for (pNVar12 = pNVar8; pNVar12 != (pointer)0x0;
        pNVar12 = (&(pNVar12->children).
                    super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                    _M_impl.super__Vector_impl_data._M_start)[iVar2 < iVar1]) {
      iVar2 = *(int *)&(pNVar12->children).
                       super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
      if (iVar1 <= iVar2) {
        pNVar7 = pNVar12;
      }
    }
    pNVar12 = (pointer)auStack_1f0;
    if ((pNVar7 != (pointer)auStack_1f0) &&
       (pNVar12 = pNVar7,
       iVar1 < *(int *)&(pNVar7->children).
                        super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage)) {
      pNVar12 = (pointer)auStack_1f0;
    }
    if (pNVar12 != (pointer)auStack_1f0) {
      sVar13 = (long)*(_Base_ptr *)&pNVar12[1].is_optional - (long)*(_Base_ptr *)(pNVar12 + 1);
      if (0x3fff < sVar13) {
        sVar13 = 0x4000;
      }
      memcpy(__s_00,*(_Base_ptr *)(pNVar12 + 1),sVar13);
      bVar6 = true;
    }
  } while ((pNVar12 == (pointer)auStack_1f0) && (lVar11 = lVar11 + 4, lVar11 != 0x10));
  this_01 = local_200;
  if (!bVar6) {
    pNVar12 = (pointer)auStack_1f0;
    for (pNVar8 = local_1e8.
                  super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                  _M_impl.super__Vector_impl_data._M_start; pNVar8 != (pointer)0x0;
        pNVar8 = (&(pNVar8->children).
                   super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                   _M_impl.super__Vector_impl_data._M_start)[iVar1 < 0x34]) {
      iVar1 = *(int *)&(pNVar8->children).
                       super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
      if (0x33 < iVar1) {
        pNVar12 = pNVar8;
      }
    }
    pNVar8 = (pointer)auStack_1f0;
    pNVar7 = local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pNVar14 = (pointer)auStack_1f0;
    if ((pNVar12 != (pointer)auStack_1f0) &&
       (pNVar14 = pNVar12,
       0x34 < *(int *)&(pNVar12->children).
                       super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage)) {
      pNVar14 = (pointer)auStack_1f0;
    }
    for (; pNVar7 != (pointer)0x0;
        pNVar7 = (&(pNVar7->children).
                   super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                   _M_impl.super__Vector_impl_data._M_start)[iVar1 < 0x35]) {
      iVar1 = *(int *)&(pNVar7->children).
                       super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
      if (0x34 < iVar1) {
        pNVar8 = pNVar7;
      }
    }
    pNVar12 = (pointer)auStack_1f0;
    if ((pNVar8 != (pointer)auStack_1f0) &&
       (pNVar12 = pNVar8,
       0x35 < *(int *)&(pNVar8->children).
                       super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage)) {
      pNVar12 = (pointer)auStack_1f0;
    }
    if ((pNVar14 != (pointer)auStack_1f0) && (pNVar12 != (pointer)auStack_1f0)) {
      sVar13 = (long)*(_Base_ptr *)&((pointer)((long)pNVar14 + 0x28))->is_optional -
               (long)*(_Base_ptr *)((long)pNVar14 + 0x28);
      if (0x1fff < sVar13) {
        sVar13 = 0x2000;
      }
      memcpy(__s_00,*(_Base_ptr *)((long)pNVar14 + 0x28),sVar13);
      this_01 = local_200;
      sVar13 = (long)*(_Base_ptr *)&pNVar12[1].is_optional - (long)*(_Base_ptr *)(pNVar12 + 1);
      if (0x1fff < sVar13) {
        sVar13 = 0x2000;
      }
      memcpy((local_200->basic_)._M_elems + 0x2000,*(_Base_ptr *)(pNVar12 + 1),sVar13);
    }
  }
  memset(&this_01->epdos_rom_,0xff,0x8000);
  pNVar12 = local_1e8.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pNVar7 = (pointer)auStack_1f0;
  for (pNVar8 = local_1e8.
                super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
                super__Vector_impl_data._M_start; pNVar8 != (pointer)0x0;
      pNVar8 = (&(pNVar8->children).
                 super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
                 .super__Vector_impl_data._M_start)[iVar1 < 0x39]) {
    iVar1 = *(int *)&(pNVar8->children).
                     super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (0x38 < iVar1) {
      pNVar7 = pNVar8;
    }
  }
  pNVar8 = (pointer)auStack_1f0;
  if ((pNVar7 != (pointer)auStack_1f0) &&
     (pNVar8 = pNVar7,
     0x39 < *(int *)&(pNVar7->children).
                     super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage)) {
    pNVar8 = (pointer)auStack_1f0;
  }
  if (pNVar8 != (pointer)auStack_1f0) {
    sVar13 = (long)*(_Base_ptr *)&pNVar8[1].is_optional - (long)*(_Base_ptr *)(pNVar8 + 1);
    if (0x7fff < sVar13) {
      sVar13 = 0x8000;
    }
    memcpy(&this_01->epdos_rom_,*(_Base_ptr *)(pNVar8 + 1),sVar13);
  }
  memset(&this_01->exdos_rom_,0xff,0x4000);
  pTVar5 = local_1c0;
  pNVar8 = (pointer)auStack_1f0;
  for (; pNVar12 != (pointer)0x0;
      pNVar12 = (&(pNVar12->children).
                  super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                  _M_impl.super__Vector_impl_data._M_start)[iVar1 < 0x3a]) {
    iVar1 = *(int *)&(pNVar12->children).
                     super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (0x39 < iVar1) {
      pNVar8 = pNVar12;
    }
  }
  pNVar12 = (pointer)auStack_1f0;
  if ((pNVar8 != (pointer)auStack_1f0) &&
     (pNVar12 = pNVar8,
     0x3a < *(int *)&(pNVar8->children).
                     super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage)) {
    pNVar12 = (pointer)auStack_1f0;
  }
  if (pNVar12 != (pointer)auStack_1f0) {
    sVar13 = (long)*(_Base_ptr *)&pNVar12[1].is_optional - (long)*(_Base_ptr *)(pNVar12 + 1);
    if (0x3fff < sVar13) {
      sVar13 = 0x4000;
    }
    memcpy(&this_01->exdos_rom_,*(_Base_ptr *)(pNVar12 + 1),sVar13);
  }
  (this_01->key_lines_)._M_elems[8] = 0xff;
  (this_01->key_lines_)._M_elems[9] = 0xff;
  (this_01->key_lines_)._M_elems[0] = 0xff;
  (this_01->key_lines_)._M_elems[1] = 0xff;
  (this_01->key_lines_)._M_elems[2] = 0xff;
  (this_01->key_lines_)._M_elems[3] = 0xff;
  (this_01->key_lines_)._M_elems[4] = 0xff;
  (this_01->key_lines_)._M_elems[5] = 0xff;
  (this_01->key_lines_)._M_elems[6] = 0xff;
  (this_01->key_lines_)._M_elems[7] = 0xff;
  this_01->pages_[0] = '\0';
  this_01->pages_[1] = '\0';
  this_01->pages_[2] = '\0';
  this_01->pages_[3] = '\0';
  this_01->read_pointers_[0] = local_f0->_M_elems;
  this_01->write_pointers_[0] = (uint8_t *)0x0;
  this_01->write_pointers_[1] = (uint8_t *)0x0;
  this_01->is_video_[0] = false;
  this_01->is_video_[1] = false;
  this_01->is_video_[2] = false;
  this_01->is_video_[3] = false;
  this_01->read_pointers_[1] = (this_01->ram_)._M_elems + 0x3c000;
  this_01->read_pointers_[2] = (this_01->ram_)._M_elems + 0x38000;
  this_01->write_pointers_[2] = (uint8_t *)0x0;
  this_01->write_pointers_[3] = (uint8_t *)0x0;
  this_01->read_pointers_[3] = (this_01->ram_)._M_elems + 0x34000;
  if ((pTVar5->loading_command)._M_string_length != 0) {
    type_string(this_01,&pTVar5->loading_command);
  }
  psVar3 = (pTVar5->super_Target).media.disks.
           super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (pTVar5->super_Target).media.disks.
           super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = true;
  if (psVar3 == psVar4) {
    if ((((pTVar5->super_Target).media.tapes.
          super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (pTVar5->super_Target).media.tapes.
          super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) &&
        ((pTVar5->super_Target).media.cartridges.
         super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (pTVar5->super_Target).media.cartridges.
         super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)) &&
       ((pTVar5->super_Target).media.mass_storage_devices.
        super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pTVar5->super_Target).media.mass_storage_devices.
        super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_003338cb;
    if (((psVar3 == psVar4) &&
        ((pTVar5->super_Target).media.tapes.
         super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (pTVar5->super_Target).media.tapes.
         super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)) &&
       ((pTVar5->super_Target).media.cartridges.
        super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pTVar5->super_Target).media.cartridges.
        super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      bVar6 = (pTVar5->super_Target).media.mass_storage_devices.
              super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pTVar5->super_Target).media.mass_storage_devices.
              super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  this_01->should_skip_splash_screen_ = bVar6;
  this_01->typer_delay_ = 2;
LAB_003338cb:
  std::
  _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)local_1f8);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_240);
  return;
}

Assistant:

ConcreteMachine(const Analyser::Static::Enterprise::Target &target, const ROMMachine::ROMFetcher &rom_fetcher) :
			min_ram_slot_(min_ram_slot(target)),
			z80_(*this),
			nick_(ram_.end() - 65536),
			dave_audio_(audio_queue_),
			speaker_(dave_audio_) {

			// Request a clock of 4Mhz; this'll be mapped upwards for Nick and downwards for Dave elsewhere.
			set_clock_rate(clock_rate);
			speaker_.set_input_rate(float(clock_rate) / float(dave_divider));

			ROM::Request request;
			using Target = Analyser::Static::Enterprise::Target;

			// Pick one or more EXOS ROMs.
			switch(target.exos_version) {
				case Target::EXOSVersion::v10:	request = request && ROM::Request(ROM::Name::EnterpriseEXOS10);	break;
				case Target::EXOSVersion::v20:	request = request && ROM::Request(ROM::Name::EnterpriseEXOS20);	break;
				case Target::EXOSVersion::v21:	request = request && ROM::Request(ROM::Name::EnterpriseEXOS21);	break;
				case Target::EXOSVersion::v23:	request = request && ROM::Request(ROM::Name::EnterpriseEXOS23);	break;
				case Target::EXOSVersion::Any:
					request =
						request && (
							ROM::Request(ROM::Name::EnterpriseEXOS10) || ROM::Request(ROM::Name::EnterpriseEXOS20) ||
							ROM::Request(ROM::Name::EnterpriseEXOS21) || ROM::Request(ROM::Name::EnterpriseEXOS23)
						);
				break;

				default: break;
			}

			// Similarly pick one or more BASIC ROMs.
			switch(target.basic_version) {
				case Target::BASICVersion::v10:
					request = request && (
						ROM::Request(ROM::Name::EnterpriseBASIC10) ||
						(ROM::Request(ROM::Name::EnterpriseBASIC10Part1) && ROM::Request(ROM::Name::EnterpriseBASIC10Part2))
					);
				break;
				case Target::BASICVersion::v11:
					request = request && (
						ROM::Request(ROM::Name::EnterpriseBASIC11) ||
						ROM::Request(ROM::Name::EnterpriseBASIC11Suffixed)
					);
				break;
				case Target::BASICVersion::v21:
					request = request && ROM::Request(ROM::Name::EnterpriseBASIC21);
				break;
				case Target::BASICVersion::Any:
					request =
						request && (
							ROM::Request(ROM::Name::EnterpriseBASIC10) ||
							(ROM::Request(ROM::Name::EnterpriseBASIC10Part1) && ROM::Request(ROM::Name::EnterpriseBASIC10Part2)) ||
							ROM::Request(ROM::Name::EnterpriseBASIC11) ||
							ROM::Request(ROM::Name::EnterpriseBASIC21)
						);
				break;

				default: break;
			}

			// Possibly add in a DOS.
			switch(target.dos) {
				case Target::DOS::EXDOS:			request = request && ROM::Request(ROM::Name::EnterpriseEXDOS);	break;
				default: break;
			}

			// Get and validate ROMs.
			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}

			// Extract the appropriate EXOS ROM.
			exos_.fill(0xff);
			for(const auto rom_name: { ROM::Name::EnterpriseEXOS10, ROM::Name::EnterpriseEXOS20, ROM::Name::EnterpriseEXOS21, ROM::Name::EnterpriseEXOS23 }) {
				const auto exos = roms.find(rom_name);
				if(exos != roms.end()) {
					memcpy(exos_.data(), exos->second.data(), std::min(exos_.size(), exos->second.size()));
					break;
				}
			}

			// Extract the appropriate BASIC ROM[s] (if any).
			basic_.fill(0xff);
			bool has_basic = false;
			for(const auto rom_name: { ROM::Name::EnterpriseBASIC10, ROM::Name::EnterpriseBASIC11, ROM::Name::EnterpriseBASIC11Suffixed, ROM::Name::EnterpriseBASIC21 }) {
				const auto basic = roms.find(rom_name);
				if(basic != roms.end()) {
					memcpy(basic_.data(), basic->second.data(), std::min(basic_.size(), basic->second.size()));
					has_basic = true;
					break;
				}
			}
			if(!has_basic) {
				const auto basic1 = roms.find(ROM::Name::EnterpriseBASIC10Part1);
				const auto basic2 = roms.find(ROM::Name::EnterpriseBASIC10Part2);
				if(basic1 != roms.end() && basic2 != roms.end()) {
					memcpy(&basic_[0x0000], basic1->second.data(), std::min(size_t(8192), basic1->second.size()));
					memcpy(&basic_[0x2000], basic2->second.data(), std::min(size_t(8192), basic2->second.size()));
				}
			}

			// Extract the appropriate DOS ROMs.
			epdos_rom_.fill(0xff);
			const auto epdos = roms.find(ROM::Name::EnterpriseEPDOS);
			if(epdos != roms.end()) {
				memcpy(epdos_rom_.data(), epdos->second.data(), std::min(epdos_rom_.size(), epdos->second.size()));
			}
			exdos_rom_.fill(0xff);
			const auto exdos = roms.find(ROM::Name::EnterpriseEXDOS);
			if(exdos != roms.end()) {
				memcpy(exdos_rom_.data(), exdos->second.data(), std::min(exdos_rom_.size(), exdos->second.size()));
			}

			// Seed key state.
			clear_all_keys();

			// Take a reasonable guess at the initial memory configuration:
			// put EXOS into the first bank since this is a Z80 and therefore
			// starts from address 0; the third instruction in EXOS is a jump
			// to $c02e so it's reasonable to assume EXOS is in the highest bank
			// too, and it appears to act correctly if it's the first 16kb that's
			// in the highest bank. From there I guess: all banks are initialised
			// to 0.
			page<0>(0x00);
			page<1>(0x00);
			page<2>(0x00);
			page<3>(0x00);

			// Pass on any media.
			insert_media(target.media);
			if(!target.loading_command.empty()) {
				type_string(target.loading_command);
			}

			// Ensure the splash screen is automatically skipped if any media has been provided.
			if(!target.media.empty()) {
				should_skip_splash_screen_ = !target.media.empty();
				typer_delay_ = 2;
			}
		}